

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O1

void helper_booke206_tlbwe_ppc64(CPUPPCState_conflict2 *env)

{
  ppcmas_tlb_t *ppVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  CPUPPCState_conflict2 *__mptr;
  _func_void_DisasContext_ptr_int_int **pp_Var6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uintptr_t unaff_retaddr;
  
  uVar9 = (uint)env->spr[0x270];
  if ((uVar9 >> 0xd & 1) != 0) {
    return;
  }
  if ((0xffffffff7fffffff < env->spr[0x270]) && ((env->msr & 0x10000000) == 0)) {
    helper_booke206_tlbwe_ppc64_cold_1();
    return;
  }
  uVar8 = (ulong)(uVar9 >> 0x1c & 3);
  uVar9 = (uint)env->spr[uVar8 + 0x2b0];
  ppVar1 = booke206_cur_tlb(env);
  if (ppVar1 == (ppcmas_tlb_t *)0x0) {
LAB_00b6b269:
    raise_exception_err_ra_ppc64(env,6,0x21,unaff_retaddr);
  }
  if ((env->spr[0x3f7] & 3) == 1) {
    uVar2 = (uint)env->spr[uVar8 + 0x158];
  }
  else {
    uVar2 = (uint)env->spr[uVar8 + 0x2b0];
    uVar3 = uVar2 >> 0x14 & 0xf;
    uVar4 = uVar2 >> 0x10 & 0xf;
    uVar2 = 0;
    if (uVar3 <= uVar4) {
      iVar5 = (uVar4 - uVar3) + 1;
      uVar3 = uVar3 * 2;
      uVar2 = 0;
      do {
        uVar2 = uVar2 | 1 << (uVar3 & 0x1f);
        uVar3 = uVar3 + 2;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
  }
  if ((((int)env->spr[0x271] < 0) && ((uVar9 & 0x4000) != 0)) &&
     ((uVar2 >> ((uint)(env->spr[0x271] >> 7) & 0x1f) & 1) == 0)) goto LAB_00b6b269;
  if ((env->msr & 0x10000000) != 0) {
    cpu_abort_ppc64((CPUState *)&env[-1].spr_cb[0x1bf].oea_write,"missing HV implementation\n");
  }
  if ((int)ppVar1->mas1 < 0) {
    pp_Var6 = &env[-1].spr_cb[0x1bf].oea_write;
    if ((ppVar1->mas1 & 0xf80) == 0x100) {
      tlb_flush_page_ppc64((CPUState *)pp_Var6,ppVar1->mas2 & 0xfffffffffffff000);
    }
    else {
      tlb_flush_ppc64((CPUState *)pp_Var6);
    }
  }
  ppVar1->mas7_3 = env->spr[0x3b0] << 0x20 | env->spr[0x273];
  uVar2 = (uint)env->spr[0x271];
  ppVar1->mas1 = uVar2;
  if ((env->spr[0x3f7] & 3) == 1) {
    iVar5 = -1;
    uVar7 = 0;
    do {
      if ((env->spr[uVar8 + 0x158] >> (uVar7 & 0x3f) & 1) != 0) {
        if (iVar5 != -1) goto LAB_00b6b1d7;
        iVar5 = (int)uVar7;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != 0x20);
    if (iVar5 == -1) {
      __assert_fail("tsize != -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/ppc/cpu.h"
                    ,0x9ee,"void booke206_fixed_size_tlbn(CPUPPCState *, const int, ppcmas_tlb_t *)"
                   );
    }
    uVar3 = iVar5 << 7;
  }
  else {
    if ((uVar9 >> 0xe & 1) != 0) goto LAB_00b6b1d7;
    uVar3 = uVar9 >> 0xc & 0xf00;
  }
  ppVar1->mas1 = uVar3 | uVar2 & 0xfffff07f;
LAB_00b6b1d7:
  uVar7 = -0x400L << ((byte)(ppVar1->mas1 >> 7) & 0x1f);
  uVar8 = uVar7 & 0xffffffff;
  if ((int)env->msr < 0) {
    uVar8 = uVar7;
  }
  uVar8 = (uVar8 | 0x7f) & env->spr[0x272];
  ppVar1->mas2 = uVar8;
  if (-1 < (short)uVar9) {
    ppVar1->mas1 = ppVar1->mas1 & 0xbfffffff;
  }
  pp_Var6 = &env[-1].spr_cb[0x1bf].oea_write;
  if ((ppVar1->mas1 & 0xf80) != 0x100) {
    tlb_flush_ppc64((CPUState *)pp_Var6);
    return;
  }
  tlb_flush_page_ppc64((CPUState *)pp_Var6,uVar8 & 0xfffffffffffff000);
  return;
}

Assistant:

void helper_booke206_tlbwe(CPUPPCState *env)
{
    uint32_t tlbncfg, tlbn;
    ppcmas_tlb_t *tlb;
    uint32_t size_tlb, size_ps;
    target_ulong mask;


    switch (env->spr[SPR_BOOKE_MAS0] & MAS0_WQ_MASK) {
    case MAS0_WQ_ALWAYS:
        /* good to go, write that entry */
        break;
    case MAS0_WQ_COND:
        /* XXX check if reserved */
        if (0) {
            return;
        }
        break;
    case MAS0_WQ_CLR_RSRV:
        /* XXX clear entry */
        return;
    default:
        /* no idea what to do */
        return;
    }

    if (((env->spr[SPR_BOOKE_MAS0] & MAS0_ATSEL) == MAS0_ATSEL_LRAT) &&
        !msr_gs) {
        /* XXX we don't support direct LRAT setting yet */
        fprintf(stderr, "cpu: don't support LRAT setting yet\n");
        return;
    }

    tlbn = (env->spr[SPR_BOOKE_MAS0] & MAS0_TLBSEL_MASK) >> MAS0_TLBSEL_SHIFT;
    tlbncfg = env->spr[SPR_BOOKE_TLB0CFG + tlbn];

    tlb = booke206_cur_tlb(env);

    if (!tlb) {
        raise_exception_err_ra(env, POWERPC_EXCP_PROGRAM,
                               POWERPC_EXCP_INVAL |
                               POWERPC_EXCP_INVAL_INVAL, GETPC());
    }

    /* check that we support the targeted size */
    size_tlb = (env->spr[SPR_BOOKE_MAS1] & MAS1_TSIZE_MASK) >> MAS1_TSIZE_SHIFT;
    size_ps = booke206_tlbnps(env, tlbn);
    if ((env->spr[SPR_BOOKE_MAS1] & MAS1_VALID) && (tlbncfg & TLBnCFG_AVAIL) &&
        !(size_ps & (1 << size_tlb))) {
        raise_exception_err_ra(env, POWERPC_EXCP_PROGRAM,
                               POWERPC_EXCP_INVAL |
                               POWERPC_EXCP_INVAL_INVAL, GETPC());
    }

    if (msr_gs) {
        cpu_abort(env_cpu(env), "missing HV implementation\n");
    }

    if (tlb->mas1 & MAS1_VALID) {
        /*
         * Invalidate the page in QEMU TLB if it was a valid entry.
         *
         * In "PowerPC e500 Core Family Reference Manual, Rev. 1",
         * Section "12.4.2 TLB Write Entry (tlbwe) Instruction":
         * (https://www.nxp.com/docs/en/reference-manual/E500CORERM.pdf)
         *
         * "Note that when an L2 TLB entry is written, it may be displacing an
         * already valid entry in the same L2 TLB location (a victim). If a
         * valid L1 TLB entry corresponds to the L2 MMU victim entry, that L1
         * TLB entry is automatically invalidated."
         */
        flush_page(env, tlb);
    }

    tlb->mas7_3 = ((uint64_t)env->spr[SPR_BOOKE_MAS7] << 32) |
        env->spr[SPR_BOOKE_MAS3];
    tlb->mas1 = env->spr[SPR_BOOKE_MAS1];

    if ((env->spr[SPR_MMUCFG] & MMUCFG_MAVN) == MMUCFG_MAVN_V2) {
        /* For TLB which has a fixed size TSIZE is ignored with MAV2 */
        booke206_fixed_size_tlbn(env, tlbn, tlb);
    } else {
        if (!(tlbncfg & TLBnCFG_AVAIL)) {
            /* force !AVAIL TLB entries to correct page size */
            tlb->mas1 &= ~MAS1_TSIZE_MASK;
            /* XXX can be configured in MMUCSR0 */
            tlb->mas1 |= (tlbncfg & TLBnCFG_MINSIZE) >> 12;
        }
    }

    /* Make a mask from TLB size to discard invalid bits in EPN field */
    mask = ~(booke206_tlb_to_page_size(env, tlb) - 1);
    /* Add a mask for page attributes */
    mask |= MAS2_ACM | MAS2_VLE | MAS2_W | MAS2_I | MAS2_M | MAS2_G | MAS2_E;

    if (!msr_cm) {
        /*
         * Executing a tlbwe instruction in 32-bit mode will set bits
         * 0:31 of the TLB EPN field to zero.
         */
        mask &= 0xffffffff;
    }

    tlb->mas2 = env->spr[SPR_BOOKE_MAS2] & mask;

    if (!(tlbncfg & TLBnCFG_IPROT)) {
        /* no IPROT supported by TLB */
        tlb->mas1 &= ~MAS1_IPROT;
    }

    flush_page(env, tlb);
}